

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

int __thiscall Fl_Menu_Item::measure(Fl_Menu_Item *this,int *hp,Fl_Menu_ *m)

{
  int *local_78;
  Fl_Fontsize local_70;
  Fl_Fontsize local_6c;
  Fl_Font local_68;
  Fl_Font local_64;
  int local_58;
  int local_54;
  int h;
  int w;
  Fl_Label l;
  Fl_Menu_ *m_local;
  int *hp_local;
  Fl_Menu_Item *this_local;
  
  _h = this->text;
  l.value = (char *)0x0;
  l.image = (Fl_Image *)0x0;
  l.color._0_1_ = this->labeltype_;
  l._40_8_ = m;
  if ((this->labelsize_ == 0) && (this->labelfont_ == 0)) {
    if (m == (Fl_Menu_ *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = Fl_Menu_::textfont(m);
    }
    local_64 = local_68;
  }
  else {
    local_64 = this->labelfont_;
  }
  l.deimage._0_4_ = local_64;
  if (this->labelsize_ == 0) {
    if (l._40_8_ == 0) {
      local_70 = FL_NORMAL_SIZE;
    }
    else {
      local_70 = Fl_Menu_::textsize((Fl_Menu_ *)l._40_8_);
    }
    local_6c = local_70;
  }
  else {
    local_6c = this->labelsize_;
  }
  l.deimage._4_4_ = local_6c;
  l.font = 0;
  fl_draw_shortcut = '\x01';
  local_54 = 0;
  local_58 = 0;
  local_78 = hp;
  if (hp == (int *)0x0) {
    local_78 = &local_58;
  }
  Fl_Label::measure((Fl_Label *)&h,&local_54,local_78);
  fl_draw_shortcut = '\0';
  if ((this->flags & 10U) != 0) {
    local_54 = FL_NORMAL_SIZE + local_54;
  }
  return local_54;
}

Assistant:

int Fl_Menu_Item::measure(int* hp, const Fl_Menu_* m) const {
  Fl_Label l;
  l.value   = text;
  l.image   = 0;
  l.deimage = 0;
  l.type    = labeltype_;
  l.font    = labelsize_ || labelfont_ ? labelfont_ : (m ? m->textfont() : FL_HELVETICA);
  l.size    = labelsize_ ? labelsize_ : m ? m->textsize() : FL_NORMAL_SIZE;
  l.color   = FL_FOREGROUND_COLOR; // this makes no difference?
  fl_draw_shortcut = 1;
  int w = 0; int h = 0;
  l.measure(w, hp ? *hp : h);
  fl_draw_shortcut = 0;
  if (flags & (FL_MENU_TOGGLE|FL_MENU_RADIO)) w += FL_NORMAL_SIZE;
  return w;
}